

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O1

int __thiscall
soplex::
SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_a8.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 8);
  local_a8.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thetolerance.m_backend.data._M_elems;
  local_a8.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 2);
  local_a8.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 4);
  local_a8.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 6);
  local_a8.exp = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thetolerance.m_backend.exp;
  local_a8.neg = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thetolerance.m_backend.neg;
  local_a8.fpclass =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  local_a8.prec_elem =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  if (local_a8.fpclass != cpp_dec_float_finite || local_a8.data._M_elems[0] != 0) {
    local_a8.neg = (bool)(local_a8.neg ^ 1);
  }
  lVar7 = (long)(((this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver)->thecovectors->set).thenum;
  if (lVar7 < 1) {
    iVar6 = -1;
  }
  else {
    lVar8 = lVar7 * 0x38 + -8;
    iVar6 = -1;
    do {
      pnVar2 = (((this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar8 + -0x10);
      local_68.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_68.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar8 + -0x30);
      local_68.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_68.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar8 + -0x20);
      local_68.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_68.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_68.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_68.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar8 + -8);
      local_68.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar8 + -4);
      local_68._48_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar8);
      if (((local_68.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
         (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_68,&local_a8), iVar5 < 0)) {
        pnVar2 = (((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_a8.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar8 + -0x10);
        puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar8 + -0x30);
        local_a8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_a8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar8 + -0x20);
        local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar8 + -8);
        local_a8.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar8 + -4);
        local_a8._48_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar8);
        iVar6 = (int)lVar7 + -1;
      }
      lVar8 = lVar8 + -0x38;
      bVar4 = 1 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar4);
  }
  return iVar6;
}

Assistant:

int SPxParMultPR<R>::selectLeave()
{
   int i, n;
   R x;
   R best = -this->thetolerance;
   //    const R* up  = this->thesolver->ubBound();
   //    const R* low = this->thesolver->lbBound();

   assert(this->thesolver != nullptr);
   n = -1;

   for(i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = this->thesolver->fTest()[i];

      // x *= EQ_PREF * (1 + (up[i] == low[i]));
      if(x < best)
      {
         n = i;
         best = this->thesolver->fTest()[i];
      }
   }

   return n;
}